

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionCube<float,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          float **transitionMatrices,int count)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  
  uVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar11 = (ulong)uVar2;
  uVar16 = uVar2 + 3;
  if (-1 < (int)uVar2) {
    uVar16 = uVar2;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar18 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
      uVar14 = 0;
      uVar11 = (ulong)uVar2;
      do {
        if (0 < (int)uVar18) {
          iVar23 = 0;
          pfVar4 = transitionMatrices[probabilityIndices[uVar14]];
          lVar13 = 0;
          do {
            if (0 < (int)uVar11) {
              lVar22 = 0;
              do {
                dVar24 = exp((double)((float)edgeLengths[uVar14] *
                                     (this->super_EigenDecomposition<float,_1>).gEigenValues
                                     [eigenIndices[lVar13]][lVar22]));
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar22] = (float)dVar24;
                lVar22 = lVar22 + 1;
                iVar3 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar11 = (ulong)iVar3;
              } while (lVar22 < (long)uVar11);
              if (0 < iVar3) {
                iVar19 = 0;
                pfVar12 = this->gCMatrices[eigenIndices[lVar13]];
                do {
                  pfVar5 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  iVar15 = 0;
                  lVar22 = (long)iVar23;
                  do {
                    lVar17 = lVar22;
                    if ((int)uVar2 < 4) {
                      auVar27 = ZEXT864(0);
                      uVar18 = 0;
                    }
                    else {
                      auVar27 = ZEXT864(0);
                      uVar18 = 0;
                      do {
                        auVar28 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar18]),auVar27._0_16_,
                                                  ZEXT416((uint)pfVar5[uVar18]));
                        auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)pfVar12[uVar18 + 1]),
                                                  ZEXT416((uint)pfVar5[uVar18 + 1]));
                        auVar28 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar18 + 2]),auVar28,
                                                  ZEXT416((uint)pfVar5[uVar18 + 2]));
                        auVar28 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar18 + 3]),auVar28,
                                                  ZEXT416((uint)pfVar5[uVar18 + 3]));
                        auVar27 = ZEXT1664(auVar28);
                        uVar18 = uVar18 + 4;
                      } while ((long)uVar18 < (long)(int)(uVar16 & 0xfffffffc));
                    }
                    auVar28 = auVar27._0_16_;
                    if ((int)uVar18 < iVar3) {
                      uVar18 = uVar18 & 0xffffffff;
                      do {
                        auVar28 = vfmadd231ss_fma(auVar27._0_16_,ZEXT416((uint)pfVar12[uVar18]),
                                                  ZEXT416((uint)pfVar5[uVar18]));
                        auVar27 = ZEXT1664(auVar28);
                        uVar18 = uVar18 + 1;
                      } while (uVar11 != uVar18);
                    }
                    auVar28 = vmaxss_avx(auVar28,ZEXT816(0) << 0x40);
                    pfVar12 = pfVar12 + uVar11;
                    iVar15 = iVar15 + 1;
                    pfVar4[lVar17] = auVar28._0_4_;
                    lVar22 = lVar17 + 1;
                  } while (iVar15 != iVar3);
                  iVar23 = (int)lVar17 + 2;
                  iVar19 = iVar19 + 1;
                  pfVar4[(int)(lVar17 + 1)] = 1.0;
                } while (iVar19 != iVar3);
              }
            }
            uVar18 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)uVar18);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar18 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
      uVar14 = 0;
      do {
        if (0 < (int)uVar18) {
          iVar23 = 0;
          pfVar4 = transitionMatrices[probabilityIndices[uVar14]];
          pfVar12 = transitionMatrices[firstDerivativeIndices[uVar14]];
          lVar13 = 0;
          do {
            if (0 < (int)uVar11) {
              lVar22 = 0;
              do {
                fVar1 = (this->super_EigenDecomposition<float,_1>).gEigenValues
                        [eigenIndices[lVar13]][lVar22];
                dVar24 = exp((double)(fVar1 * (float)edgeLengths[uVar14]));
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar22] = (float)dVar24;
                (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar22] =
                     (float)dVar24 * fVar1;
                lVar22 = lVar22 + 1;
                iVar3 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar11 = (ulong)iVar3;
              } while (lVar22 < (long)uVar11);
              if (0 < iVar3) {
                iVar19 = eigenIndices[lVar13];
                iVar15 = 0;
                lVar22 = 0;
                do {
                  pfVar5 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  pfVar6 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
                  iVar20 = 0;
                  pfVar7 = this->gCMatrices[iVar19];
                  lVar17 = (long)iVar23;
                  do {
                    lVar21 = lVar17;
                    auVar26 = ZEXT816(0) << 0x40;
                    auVar28 = ZEXT816(0) << 0x40;
                    uVar18 = 0;
                    do {
                      auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)pfVar7[(long)(int)lVar22 +
                                                                             uVar18]),
                                                ZEXT416((uint)pfVar5[uVar18]));
                      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)pfVar7[(long)(int)lVar22 +
                                                                             uVar18]),
                                                ZEXT416((uint)pfVar6[uVar18]));
                      uVar18 = uVar18 + 1;
                    } while (uVar11 != uVar18);
                    auVar28 = vmaxss_avx(auVar28,ZEXT816(0) << 0x40);
                    lVar22 = (long)(int)lVar22 + uVar11;
                    iVar20 = iVar20 + 1;
                    pfVar4[lVar21] = auVar28._0_4_;
                    pfVar12[lVar21] = auVar26._0_4_;
                    lVar17 = lVar21 + 1;
                  } while (iVar20 != iVar3);
                  iVar20 = (int)(lVar21 + 1);
                  iVar23 = (int)lVar21 + 2;
                  iVar15 = iVar15 + 1;
                  pfVar4[iVar20] = 1.0;
                  pfVar12[iVar20] = 0.0;
                } while (iVar15 != iVar3);
              }
            }
            uVar18 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)uVar18);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != (uint)count);
    }
  }
  else if (0 < count) {
    uVar18 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
    uVar14 = 0;
    do {
      if (0 < (int)uVar18) {
        iVar23 = 0;
        pfVar4 = transitionMatrices[probabilityIndices[uVar14]];
        pfVar12 = transitionMatrices[firstDerivativeIndices[uVar14]];
        pfVar5 = transitionMatrices[secondDerivativeIndices[uVar14]];
        lVar13 = 0;
        do {
          if (0 < (int)uVar11) {
            lVar22 = 0;
            do {
              fVar1 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndices[lVar13]]
                      [lVar22];
              dVar24 = exp((double)(fVar1 * (float)edgeLengths[uVar14]));
              (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar22] = (float)dVar24;
              fVar10 = fVar1 * (float)dVar24;
              (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar22] = fVar10;
              (this->super_EigenDecomposition<float,_1>).secondDerivTmp[lVar22] = fVar1 * fVar10;
              lVar22 = lVar22 + 1;
              iVar3 = (this->super_EigenDecomposition<float,_1>).kStateCount;
              uVar11 = (ulong)iVar3;
            } while (lVar22 < (long)uVar11);
            if (0 < iVar3) {
              iVar19 = eigenIndices[lVar13];
              iVar15 = 0;
              lVar22 = 0;
              do {
                pfVar6 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                pfVar7 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
                pfVar8 = (this->super_EigenDecomposition<float,_1>).secondDerivTmp;
                iVar20 = 0;
                pfVar9 = this->gCMatrices[iVar19];
                lVar17 = (long)iVar23;
                do {
                  lVar21 = lVar17;
                  auVar25 = ZEXT816(0) << 0x40;
                  auVar26 = ZEXT816(0) << 0x40;
                  auVar28 = ZEXT816(0) << 0x40;
                  uVar18 = 0;
                  do {
                    fVar1 = pfVar9[(long)(int)lVar22 + uVar18];
                    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar1),
                                              ZEXT416((uint)pfVar6[uVar18]));
                    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar1),
                                              ZEXT416((uint)pfVar7[uVar18]));
                    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar1),
                                              ZEXT416((uint)pfVar8[uVar18]));
                    uVar18 = uVar18 + 1;
                  } while (uVar11 != uVar18);
                  auVar28 = vmaxss_avx(auVar28,ZEXT816(0) << 0x40);
                  lVar22 = (long)(int)lVar22 + uVar11;
                  iVar20 = iVar20 + 1;
                  pfVar4[lVar21] = auVar28._0_4_;
                  pfVar12[lVar21] = auVar26._0_4_;
                  pfVar5[lVar21] = auVar25._0_4_;
                  lVar17 = lVar21 + 1;
                } while (iVar20 != iVar3);
                iVar20 = (int)(lVar21 + 1);
                iVar23 = (int)lVar21 + 2;
                iVar15 = iVar15 + 1;
                pfVar4[iVar20] = 1.0;
                pfVar12[iVar20] = 0.0;
                pfVar5[iVar20] = 0.0;
              } while (iVar15 != iVar3);
            }
          }
          uVar18 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
          lVar13 = lVar13 + 1;
        } while (lVar13 < (long)uVar18);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL													  
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
													  
	if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
                for (int i = 0; i < kStateCount; i++) {
					matrixTmp[i] = exp(gEigenValues[eigenIndices[l]][i] * ((REALTYPE)edgeLengths[u]));
                }
				
                REALTYPE* tmpCMatrices = gCMatrices[eigenIndices[l]];
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
#ifdef UNROLL						
						int k = 0;
						for (; k < stateCountModFour; k += 4) {
							sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
							sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
							sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
							sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
						}
						for (; k < kStateCount; k++) {
							sum += tmpCMatrices[k] * matrixTmp[k];
						}
						tmpCMatrices += kStateCount;
#else
						for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif						
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
					n += T_PAD;
}
				}
			}
			
			if (DEBUGGING_OUTPUT) {
                int kMatrixSize = kStateCount * kStateCount;
				fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
				for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
					fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
			}
		}
        

	} else if (secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	} else {		
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
					secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						REALTYPE sumD2 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							sumD2 += gCMatrices[eigenIndices[l]][m] * secondDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						secondDerivMat[n] = sumD2;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
                    secondDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	}
}